

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  long lVar4;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  if (under_this_window == (ImGuiWindow *)0x0) {
    uVar3 = (GImGui->WindowsFocusOrder).Size;
  }
  else {
    uVar3 = FindWindowFocusIndex(under_this_window);
  }
  if ((int)uVar3 < 1) {
    window = (ImGuiWindow *)0x0;
  }
  else {
    lVar4 = (ulong)uVar3 + 1;
    window = (ImGuiWindow *)0x0;
    do {
      if ((pIVar2->WindowsFocusOrder).Size < (int)uVar3) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                      ,0x68b,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar1 = (pIVar2->WindowsFocusOrder).Data[lVar4 + -2];
      if (pIVar1 != pIVar1->RootWindow) {
        __assert_fail("window == window->RootWindow",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                      ,0x1967,"void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *, ImGuiWindow *)"
                     );
      }
      if (((pIVar1 != ignore_window) && (pIVar1->WasActive == true)) &&
         ((~pIVar1->Flags & 0x40200U) != 0)) {
        window = pIVar1->NavLastChildNavWindow;
        if ((window == (ImGuiWindow *)0x0) || (window->WasActive == false)) {
          window = pIVar1;
        }
        break;
      }
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  FocusWindow(window);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    const int start_idx = ((under_this_window != NULL) ? FindWindowFocusIndex(under_this_window) : g.WindowsFocusOrder.Size) - 1;
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}